

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d1c3::BuildEngineTest_SimpleCycle_Test::~BuildEngineTest_SimpleCycle_Test
          (BuildEngineTest_SimpleCycle_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BuildEngineTest, SimpleCycle) {
  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "A", {"B"}, [&](const std::vector<int>& inputs) {
          return 2; })));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "B", {"A"}, [&](const std::vector<int>& inputs) {
          return 2; })));

  // Build the result.
  auto result = engine.build("A");
  EXPECT_EQ(ValueType{}, result);
  EXPECT_EQ(std::vector<std::string>({ "A", "B", "A" }), delegate.cycle);
}